

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::MyRead(void *pp,void *data,size_t *size)

{
  ulong *in_RDX;
  void *in_RSI;
  long in_RDI;
  CSeqInStreamBuf *p;
  size_t curSize;
  undefined8 local_20;
  
  local_20 = *in_RDX;
  if (*(ulong *)(in_RDI + 0x10) < local_20) {
    local_20 = *(size_t *)(in_RDI + 0x10);
  }
  memcpy(in_RSI,*(void **)(in_RDI + 8),local_20);
  *(ulong *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - local_20;
  *(ulong *)(in_RDI + 8) = local_20 + *(long *)(in_RDI + 8);
  *in_RDX = local_20;
  return 0;
}

Assistant:

static SRes MyRead(void* pp, void* data, size_t* size) {
  size_t curSize = *size;
  CSeqInStreamBuf* p = (CSeqInStreamBuf*)pp;
  if (p->rem < curSize)
    curSize = p->rem;
  memcpy(data, p->data, curSize);
  p->rem -= curSize;
  p->data += curSize;
  *size = curSize;
  return SZ_OK;
}